

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CordInputStream::CordInputStream(CordInputStream *this,Cord *cord)

{
  ulong uVar1;
  
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__ZeroCopyInputStream_005879e8;
  absl::lts_20250127::Cord::CharIterator::CharIterator(&this->it_,cord);
  uVar1 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
  if ((uVar1 & 1) == 0) {
    uVar1 = uVar1 >> 1;
  }
  else {
    uVar1 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  this->length_ = uVar1;
  this->bytes_remaining_ = uVar1;
  LoadChunkData(this);
  return;
}

Assistant:

CordInputStream::CordInputStream(const absl::Cord* cord)
    : it_(cord->char_begin()),
      length_(cord->size()),
      bytes_remaining_(length_) {
  LoadChunkData();
}